

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# importer.cpp
# Opt level: O2

bool __thiscall
libcellml::Importer::ImporterImpl::checkComponentForCycles
          (ImporterImpl *this,ComponentPtr *component,History *history)

{
  IssueImpl *pIVar1;
  AnyCellmlElementImpl *pAVar2;
  bool bVar3;
  bool bVar4;
  string local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  IssuePtr issue_1;
  IssuePtr issue;
  ComponentPtr importedComponent;
  HistoryEpochPtr h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  ModelPtr model;
  ModelPtr componentModel;
  string resolvingUrl;
  string local_68;
  string local_48;
  
  ImportedEntity::importSource((ImportedEntity *)&local_198);
  resolvingUrl_abi_cxx11_(&resolvingUrl,this,(ImportSourcePtr *)&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
  std::__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::ParentedEntity_const,(__gnu_cxx::_Lock_policy)2> *)&local_198,
             &component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
  owningModel((ParentedEntityConstPtr *)&componentModel);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
  std::__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Component,void>
            ((__shared_ptr<libcellml::Component_const,(__gnu_cxx::_Lock_policy)2> *)&local_178,
             &component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>);
  modelUrl_abi_cxx11_(&local_198,this,&componentModel);
  createHistoryEpoch((libcellml *)&h,(ComponentConstPtr *)&local_178,&local_198,&resolvingUrl);
  std::__cxx11::string::~string((string *)&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
  ImportedEntity::importSource((ImportedEntity *)&local_178);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_198,"flatten",(allocator<char> *)&local_108);
  bVar3 = checkForImportCycles(this,(ImportSourcePtr *)&local_178,history,&h,&local_198);
  std::__cxx11::string::~string((string *)&local_198);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_178._M_string_length);
  bVar4 = true;
  if (bVar3) goto LAB_001ed859;
  std::
  vector<std::shared_ptr<libcellml::HistoryEpoch>,_std::allocator<std::shared_ptr<libcellml::HistoryEpoch>_>_>
  ::push_back(history,&h);
  ImportedEntity::importSource((ImportedEntity *)&local_198);
  ImportSource::model((ImportSource *)&model);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
  if (model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
      (element_type *)0x0) {
    Issue::IssueImpl::create();
    pIVar1 = (issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->mPimpl
    ;
    NamedEntity::name_abi_cxx11_
              (&local_e8,
               (NamedEntity *)
               (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
               _M_ptr);
    std::operator+(&local_c8,"Component \'",&local_e8);
    std::operator+(&local_108,&local_c8,"\' requires a model imported from \'");
    std::operator+(&local_178,&local_108,&resolvingUrl);
    std::operator+(&local_198,&local_178,"\' which is not available in the importer.");
    Issue::IssueImpl::setDescription(pIVar1,&local_198);
    std::__cxx11::string::~string((string *)&local_198);
    std::__cxx11::string::~string((string *)&local_178);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    pAVar2 = (((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl->mItem).
              super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
             mPimpl;
    ImportedEntity::importSource((ImportedEntity *)&local_198);
    AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar2,(ImportSourcePtr *)&local_198);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
    Issue::IssueImpl::setReferenceRule
              ((issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl,IMPORTER_NULL_MODEL);
    Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&issue.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    bVar4 = true;
  }
  else {
    ImportedEntity::importReference_abi_cxx11_
              (&local_198,
               &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->super_ImportedEntity);
    ComponentEntity::component
              ((ComponentEntity *)&importedComponent,
               (string *)
               model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               SUB81(&local_198,0));
    std::__cxx11::string::~string((string *)&local_198);
    if (importedComponent.super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      Issue::IssueImpl::create();
      pIVar1 = (issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
               mPimpl;
      NamedEntity::name_abi_cxx11_
                (&local_48,
                 (NamedEntity *)
                 (component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>).
                 _M_ptr);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     "Component \'",&local_48);
      std::operator+(&local_e8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&issue,
                     "\' imports a component named \'");
      ImportedEntity::importReference_abi_cxx11_
                (&local_68,
                 &((component->super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>)
                  ._M_ptr)->super_ImportedEntity);
      std::operator+(&local_c8,&local_e8,&local_68);
      std::operator+(&local_108,&local_c8,"\' from the model imported from \'");
      std::operator+(&local_178,&local_108,&resolvingUrl);
      std::operator+(&local_198,&local_178,"\'. The component could not be found.");
      Issue::IssueImpl::setDescription(pIVar1,&local_198);
      std::__cxx11::string::~string((string *)&local_198);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_108);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_68);
      std::__cxx11::string::~string((string *)&local_e8);
      std::__cxx11::string::~string((string *)&issue);
      std::__cxx11::string::~string((string *)&local_48);
      pAVar2 = (((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl->mItem).
                super___shared_ptr<libcellml::AnyCellmlElement,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->mPimpl;
      ImportedEntity::importSource((ImportedEntity *)&local_198);
      AnyCellmlElement::AnyCellmlElementImpl::setImportSource(pAVar2,(ImportSourcePtr *)&local_198);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_198._M_string_length);
      Issue::IssueImpl::setReferenceRule
                ((issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                 mPimpl,IMPORTER_MISSING_COMPONENT);
      Logger::LoggerImpl::addIssue(&this->super_LoggerImpl,&issue_1);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&issue_1.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      bVar4 = true;
    }
    else {
      bVar3 = ImportedEntity::isImport
                        (&(importedComponent.
                           super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>.
                          _M_ptr)->super_ImportedEntity);
      if (bVar3) {
        bVar3 = checkComponentForCycles(this,&importedComponent,history);
        bVar4 = true;
        if (bVar3) goto LAB_001ed842;
      }
      bVar4 = false;
    }
LAB_001ed842:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&importedComponent.
                super___shared_ptr<libcellml::Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
LAB_001ed859:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&h.super___shared_ptr<libcellml::HistoryEpoch,_(__gnu_cxx::_Lock_policy)2>._M_refcount)
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&componentModel.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__cxx11::string::~string((string *)&resolvingUrl);
  return bVar4;
}

Assistant:

bool Importer::ImporterImpl::checkComponentForCycles(const ComponentPtr &component, History &history)
{
    std::string resolvingUrl = ImporterImpl::resolvingUrl(component->importSource());
    auto componentModel = owningModel(component);
    auto h = createHistoryEpoch(component, modelUrl(componentModel), resolvingUrl);

    if (checkForImportCycles(component->importSource(), history, h, "flatten")) {
        return true;
    }

    history.push_back(h);

    // If the dependencies have not been recorded already, then check it.
    auto model = component->importSource()->model();
    if (model == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Component '" + component->name() + "' requires a model imported from '" + resolvingUrl + "' which is not available in the importer.");
        issue->mPimpl->mItem->mPimpl->setImportSource(component->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_NULL_MODEL);
        addIssue(issue);
        return true;
    }
    auto importedComponent = model->component(component->importReference(), true);
    if (importedComponent == nullptr) {
        auto issue = Issue::IssueImpl::create();
        issue->mPimpl->setDescription("Component '" + component->name() + "' imports a component named '" + component->importReference() + "' from the model imported from '" + resolvingUrl + "'. The component could not be found.");
        issue->mPimpl->mItem->mPimpl->setImportSource(component->importSource());
        issue->mPimpl->setReferenceRule(Issue::ReferenceRule::IMPORTER_MISSING_COMPONENT);
        addIssue(issue);
        return true;
    }

    if (importedComponent->isImport() && checkComponentForCycles(importedComponent, history)) {
        return true;
    }

    return false;
}